

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O3

void Abc_SclApplyUpdateToBest(Vec_Int_t *vGatesBest,Vec_Int_t *vGates,Vec_Int_t *vUpdate)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (1 < vUpdate->nSize) {
    piVar2 = vUpdate->pArray;
    lVar3 = 1;
    do {
      iVar1 = piVar2[lVar3 + -1];
      if (((long)iVar1 < 0) || (vGatesBest->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vGatesBest->pArray[iVar1] = piVar2[lVar3];
      lVar3 = lVar3 + 2;
    } while ((int)lVar3 < vUpdate->nSize);
  }
  vUpdate->nSize = 0;
  if (0 < (long)vGatesBest->nSize) {
    uVar5 = 0;
    uVar4 = (ulong)(uint)vGates->nSize;
    if (vGates->nSize < 1) {
      uVar4 = uVar5;
    }
    do {
      if (uVar4 == uVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vGatesBest->pArray[uVar5] != vGates->pArray[uVar5]) {
        __assert_fail("GateId == GateId2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                      ,0x2cc,"void Abc_SclApplyUpdateToBest(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)")
        ;
      }
      uVar5 = uVar5 + 1;
    } while ((long)vGatesBest->nSize != uVar5);
  }
  return;
}

Assistant:

void Abc_SclApplyUpdateToBest( Vec_Int_t * vGatesBest, Vec_Int_t * vGates, Vec_Int_t * vUpdate )
{
    int i, ObjId, GateId, GateId2; 
    Vec_IntForEachEntryDouble( vUpdate, ObjId, GateId, i )
        Vec_IntWriteEntry( vGatesBest, ObjId, GateId );
    Vec_IntClear( vUpdate );
    Vec_IntForEachEntryTwo( vGatesBest, vGates, GateId, GateId2, i )
        assert( GateId == GateId2 );
//    Vec_IntClear( vGatesBest );
//    Vec_IntAppend( vGatesBest, vGates );
}